

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriggerVariable.hpp
# Opt level: O0

bool __thiscall
gmlc::concurrency::TriggerVariable::wait_for(TriggerVariable *this,milliseconds *duration)

{
  bool bVar1;
  condition_variable *in_RSI;
  TriggerVariable *in_RDI;
  unique_lock<std::mutex> lk;
  mutex_type *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  duration<long,_std::ratio<1L,_1000L>_> *in_stack_ffffffffffffffd8;
  unique_lock<std::mutex> *in_stack_ffffffffffffffe0;
  anon_class_8_1_8991fb9c __p;
  undefined1 local_1;
  
  __p.this = in_RDI;
  bVar1 = isActive((TriggerVariable *)0x3a682d);
  if (bVar1) {
    std::unique_lock<std::mutex>::unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
               in_stack_ffffffffffffffa8);
    bVar1 = std::atomic::operator_cast_to_bool(&in_RDI->triggered);
    if (bVar1) {
      local_1 = true;
    }
    else {
      in_stack_ffffffffffffffb7 =
           std::condition_variable::
           wait_for<long,std::ratio<1l,1000l>,gmlc::concurrency::TriggerVariable::wait_for(std::chrono::duration<long,std::ratio<1l,1000l>>const&)const::_lambda()_1_>
                     (in_RSI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,__p);
      local_1 = (bool)in_stack_ffffffffffffffb7;
    }
    std::unique_lock<std::mutex>::~unique_lock
              ((unique_lock<std::mutex> *)
               CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool wait_for(const std::chrono::milliseconds& duration) const
    {
        if (!isActive()) {
            return true;
        }
        std::unique_lock<std::mutex> lk(triggerLock);
        if (!triggered) {
            return cv_trigger.wait_for(lk, duration, [this] {
                return triggered.load();
            });
        }
        return true;
    }